

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::TimezoneFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  undefined8 *puVar2;
  duckdb *in_RDI;
  undefined8 *puVar3;
  long lVar4;
  ScalarFunction *func;
  BaseScalarFunction *function_00;
  byte bVar5;
  initializer_list<duckdb::LogicalType> __l;
  ScalarFunction function;
  code *local_3f8;
  undefined8 uStack_3f0;
  code *local_3e8;
  code *pcStack_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *apcStack_3c0 [3];
  scalar_function_t local_3a8;
  LogicalType local_380 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_368;
  LogicalType local_350 [24];
  _Any_data local_338;
  _Manager_type local_328;
  code *pcStack_320;
  LogicalType aLStack_2a8 [32];
  _Any_data _Stack_288;
  _Manager_type local_278;
  undefined8 auStack_268 [9];
  element_type *local_220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_208 [176];
  _Any_data local_158;
  _Manager_type local_148;
  undefined8 auStack_138 [9];
  element_type *local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  BaseScalarFunction local_e0 [176];
  
  bVar5 = 0;
  local_338._8_8_ = 0;
  local_338._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::TimezoneOperator>;
  pcStack_320 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_328 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  local_3d8._8_8_ = 0;
  local_3d8._M_unused._M_function_pointer =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::TimezoneOperator>;
  apcStack_3c0[0] =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  local_3a8.super__Function_base._M_functor._8_8_ = 0;
  local_3a8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::TimezoneOperator>;
  local_3a8._M_invoker =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3a8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  GetGenericDatePartFunction<(duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>(*)(duckdb::ExpressionState&,duckdb::BoundFunctionExpression_const&,duckdb::FunctionData*))0>
            (in_RDI,(scalar_function_t *)&local_338,(scalar_function_t *)&local_3d8,&local_3a8,
             DatePart::TimezoneOperator::PropagateStatistics<duckdb::date_t>,
             DatePart::TimezoneOperator::PropagateStatistics<duckdb::timestamp_t>);
  if (local_3a8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.super__Function_base._M_manager)
              ((_Any_data *)&local_3a8,(_Any_data *)&local_3a8,__destroy_functor);
  }
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
  }
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,__destroy_functor);
  }
  duckdb::LogicalType::LogicalType((LogicalType *)local_3d8._M_pod_data,INTERVAL);
  duckdb::LogicalType::LogicalType((LogicalType *)apcStack_3c0,TIME_TZ);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_3d8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_368,__l,(allocator_type *)&local_3a8);
  duckdb::LogicalType::LogicalType(local_380,TIME_TZ);
  uStack_3f0 = 0;
  local_3f8 = DatePart::TimezoneOperator::
              BinaryFunction<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t>;
  pcStack_3e0 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_3e8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_350,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)&local_338,&local_368,local_380,&local_3f8,0,0,0,0,local_350,0,0,0);
  duckdb::LogicalType::~LogicalType(local_350);
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,3);
  }
  duckdb::LogicalType::~LogicalType(local_380);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_368);
  lVar4 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_3d8._M_pod_data + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  SimpleFunction::SimpleFunction
            ((SimpleFunction *)local_208,(SimpleFunction *)local_338._M_pod_data);
  local_208._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_208 + 0x90),aLStack_2a8);
  local_208[0xa8] = aLStack_2a8[0x18];
  local_208[0xa9] = aLStack_2a8[0x19];
  local_208[0xaa] = aLStack_2a8[0x1a];
  local_208[0xab] = aLStack_2a8[0x1b];
  local_208._0_8_ = &PTR__ScalarFunction_008984e0;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_158,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_288);
  puVar2 = auStack_268;
  puVar3 = auStack_138;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar5 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
  }
  local_f0 = local_220;
  local_e8._M_pi = local_218._M_pi;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_218._M_pi)->_M_use_count = (local_218._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_218._M_pi)->_M_use_count = (local_218._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),(ScalarFunction *)local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  if (local_148 != (_Manager_type)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_208);
  function_00 = *(BaseScalarFunction **)(in_RDI + 0x20);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  if (function_00 != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function_00);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function_00 = function_00 + 0x128;
    } while (function_00 != pBVar1);
  }
  local_338._M_unused._M_object = &PTR__ScalarFunction_008984e0;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_278 != (code *)0x0) {
    (*local_278)(&_Stack_288,&_Stack_288,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_338._M_pod_data);
  return;
}

Assistant:

ScalarFunctionSet TimezoneFun::GetFunctions() {
	auto operator_set = GetDatePartFunction<DatePart::TimezoneOperator>();

	//	PG also defines timezone(INTERVAL, TIME_TZ) => TIME_TZ
	ScalarFunction function({LogicalType::INTERVAL, LogicalType::TIME_TZ}, LogicalType::TIME_TZ,
	                        DatePart::TimezoneOperator::BinaryFunction<interval_t, dtime_tz_t, dtime_tz_t>);

	operator_set.AddFunction(function);

	for (auto &func : operator_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}

	return operator_set;
}